

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

bool __thiscall ImFontAtlas::Build(ImFontAtlas *this)

{
  ushort uVar1;
  Glyph *pGVar2;
  bool bVar3;
  int iVar4;
  void *ptr;
  value_type *pvVar5;
  ImWchar *pIVar6;
  value_type *pvVar7;
  uchar *puVar8;
  Glyph *pGVar9;
  value_type *pvVar10;
  bool bVar11;
  float fVar12;
  float local_280;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  Glyph *glyph;
  float local_1c0;
  float dummy_y;
  float dummy_x;
  stbtt_aligned_quad q;
  int codepoint;
  stbtt_packedchar *pc;
  int char_idx;
  stbtt_pack_range *range_1;
  int i_3;
  float off_y;
  float descent;
  float ascent;
  int unscaled_line_gap;
  int unscaled_descent;
  int unscaled_ascent;
  float font_scale;
  ImFont *dst_font;
  ImFontTempBuildData *tmp_3;
  ImFontConfig *cfg_3;
  stbtt_fontinfo *psStack_140;
  int input_i_3;
  ImFontTempBuildData *tmp_2;
  ImFontConfig *cfg_2;
  int local_128;
  int input_i_2;
  int i_2;
  int n;
  stbtt_pack_range *range;
  ImWchar *in_range_2;
  ushort *puStack_108;
  int i_1;
  ImWchar *in_range_1;
  int glyph_ranges_count;
  int glyph_count;
  ImFontTempBuildData *tmp_1;
  ImFontConfig *cfg_1;
  void *pvStack_e0;
  int input_i_1;
  stbtt_pack_range *buf_ranges;
  stbrp_rect *buf_rects;
  stbtt_packedchar *buf_packedchars;
  int local_c0;
  int buf_ranges_n;
  int buf_rects_n;
  int buf_packedchars_n;
  int i;
  undefined1 local_a8 [8];
  ImVector<stbrp_rect> extra_rects;
  stbtt_pack_context spc;
  ushort *puStack_58;
  int max_tex_height;
  ImWchar *in_range;
  int font_offset;
  ImFontTempBuildData *tmp;
  ImFontConfig *cfg;
  int local_30;
  int input_i;
  int total_glyph_range_count;
  int total_glyph_count;
  ImFontTempBuildData *tmp_array;
  ImFontAtlas *local_18;
  ImFontAtlas *this_local;
  
  local_18 = this;
  if ((this->ConfigData).Size < 1) {
    __assert_fail("ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                  ,0x4e1,"bool ImFontAtlas::Build()");
  }
  this->TexID = (void *)0x0;
  this->TexHeight = 0;
  this->TexWidth = 0;
  ImVec2::ImVec2((ImVec2 *)&tmp_array,0.0,0.0);
  this->TexUvWhitePixel = (ImVec2)tmp_array;
  ClearTexData(this);
  ptr = ImGui::MemAlloc((long)(this->ConfigData).Size * 0x50);
  input_i = 0;
  local_30 = 0;
  cfg._4_4_ = 0;
  do {
    if ((this->ConfigData).Size <= cfg._4_4_) {
      if (this->TexDesiredWidth < 1) {
        if (input_i < 0xfa1) {
          if (input_i < 0x7d1) {
            local_1e8 = 0x200;
            if (1000 < input_i) {
              local_1e8 = 0x400;
            }
          }
          else {
            local_1e8 = 0x800;
          }
          local_1e4 = local_1e8;
        }
        else {
          local_1e4 = 0x1000;
        }
        local_1e0 = local_1e4;
      }
      else {
        local_1e0 = this->TexDesiredWidth;
      }
      this->TexWidth = local_1e0;
      this->TexHeight = 0;
      stbtt_PackBegin((stbtt_pack_context *)&extra_rects.Data,(uchar *)0x0,this->TexWidth,0x8000,0,1
                      ,(void *)0x0);
      ImVector<stbrp_rect>::ImVector((ImVector<stbrp_rect> *)local_a8);
      RenderCustomTexData(this,0,(ImVector<stbrp_rect> *)local_a8);
      stbtt_PackSetOversampling((stbtt_pack_context *)&extra_rects.Data,1,1);
      pvVar7 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)local_a8,0);
      stbrp_pack_rects((stbrp_context *)spc.user_allocator_context,pvVar7,local_a8._0_4_);
      for (buf_rects_n = 0; buf_rects_n < (int)local_a8._0_4_; buf_rects_n = buf_rects_n + 1) {
        pvVar7 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)local_a8,buf_rects_n);
        if (pvVar7->was_packed != 0) {
          iVar4 = this->TexHeight;
          pvVar7 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)local_a8,buf_rects_n);
          uVar1 = pvVar7->y;
          pvVar7 = ImVector<stbrp_rect>::operator[]((ImVector<stbrp_rect> *)local_a8,buf_rects_n);
          iVar4 = ImMax(iVar4,(uint)uVar1 + (uint)pvVar7->h);
          this->TexHeight = iVar4;
        }
      }
      buf_ranges_n = 0;
      local_c0 = 0;
      buf_packedchars._4_4_ = 0;
      buf_rects = (stbrp_rect *)ImGui::MemAlloc((long)input_i * 0x1c);
      buf_ranges = (stbtt_pack_range *)ImGui::MemAlloc((long)input_i << 4);
      pvStack_e0 = ImGui::MemAlloc((long)local_30 * 0x28);
      memset(buf_rects,0,(long)input_i * 0x1c);
      memset(buf_ranges,0,(long)input_i << 4);
      memset(pvStack_e0,0,(long)local_30 * 0x28);
      for (cfg_1._4_4_ = 0; cfg_1._4_4_ < (this->ConfigData).Size; cfg_1._4_4_ = cfg_1._4_4_ + 1) {
        tmp_1 = (ImFontTempBuildData *)
                ImVector<ImFontConfig>::operator[](&this->ConfigData,cfg_1._4_4_);
        _glyph_ranges_count = (stbtt_fontinfo *)((long)ptr + (long)cfg_1._4_4_ * 0x50);
        in_range_1._4_4_ = 0;
        in_range_1._0_4_ = 0;
        puStack_108 = ((value_type *)tmp_1)->GlyphRanges;
        while( true ) {
          bVar11 = false;
          if (*puStack_108 != 0) {
            bVar11 = puStack_108[1] != 0;
          }
          if (!bVar11) break;
          in_range_1._4_4_ = ((uint)puStack_108[1] - (uint)*puStack_108) + 1 + in_range_1._4_4_;
          in_range_1._0_4_ = (int)in_range_1 + 1;
          puStack_108 = puStack_108 + 2;
        }
        _glyph_ranges_count[1].data =
             (uchar *)((long)pvStack_e0 + (long)buf_packedchars._4_4_ * 0x28);
        _glyph_ranges_count[1].fontstart = (int)in_range_1;
        buf_packedchars._4_4_ = (int)in_range_1 + buf_packedchars._4_4_;
        for (in_range_2._4_4_ = 0; in_range_2._4_4_ < (int)in_range_1;
            in_range_2._4_4_ = in_range_2._4_4_ + 1) {
          range = (stbtt_pack_range *)(((value_type *)tmp_1)->GlyphRanges + (in_range_2._4_4_ << 1))
          ;
          _i_2 = (float *)(_glyph_ranges_count[1].data + (long)in_range_2._4_4_ * 0x28);
          *_i_2 = ((value_type *)tmp_1)->SizePixels;
          _i_2[1] = (float)(uint)*(ushort *)&range->font_size;
          _i_2[4] = (float)(((uint)*(ushort *)((long)&range->font_size + 2) -
                            (uint)*(ushort *)&range->font_size) + 1);
          *(long *)(_i_2 + 6) = (long)buf_rects + (long)buf_ranges_n * 0x1c;
          buf_ranges_n = (int)_i_2[4] + buf_ranges_n;
        }
        _glyph_ranges_count[1].userdata = &buf_ranges->font_size + (long)local_c0 * 4;
        local_c0 = local_c0 + in_range_1._4_4_;
        stbtt_PackSetOversampling
                  ((stbtt_pack_context *)&extra_rects.Data,((value_type *)tmp_1)->OversampleH,
                   ((value_type *)tmp_1)->OversampleV);
        input_i_2 = stbtt_PackFontRangesGatherRects
                              ((stbtt_pack_context *)&extra_rects.Data,_glyph_ranges_count,
                               (stbtt_pack_range *)_glyph_ranges_count[1].data,
                               _glyph_ranges_count[1].fontstart,
                               (stbrp_rect *)_glyph_ranges_count[1].userdata);
        stbrp_pack_rects((stbrp_context *)spc.user_allocator_context,
                         (stbrp_rect *)_glyph_ranges_count[1].userdata,input_i_2);
        for (local_128 = 0; local_128 < input_i_2; local_128 = local_128 + 1) {
          if (*(int *)((long)_glyph_ranges_count[1].userdata + (long)local_128 * 0x10 + 0xc) != 0) {
            iVar4 = ImMax(this->TexHeight,
                          (uint)*(ushort *)
                                 ((long)_glyph_ranges_count[1].userdata +
                                 (long)local_128 * 0x10 + 10) +
                          (uint)*(ushort *)
                                 ((long)_glyph_ranges_count[1].userdata + (long)local_128 * 0x10 + 6
                                 ));
            this->TexHeight = iVar4;
          }
        }
      }
      if (local_c0 != input_i) {
        __assert_fail("buf_rects_n == total_glyph_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                      ,0x54b,"bool ImFontAtlas::Build()");
      }
      if (buf_ranges_n != input_i) {
        __assert_fail("buf_packedchars_n == total_glyph_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                      ,0x54c,"bool ImFontAtlas::Build()");
      }
      if (buf_packedchars._4_4_ != local_30) {
        __assert_fail("buf_ranges_n == total_glyph_range_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                      ,0x54d,"bool ImFontAtlas::Build()");
      }
      iVar4 = ImUpperPowerOfTwo(this->TexHeight);
      this->TexHeight = iVar4;
      puVar8 = (uchar *)ImGui::MemAlloc((long)(this->TexWidth * this->TexHeight));
      this->TexPixelsAlpha8 = puVar8;
      memset(this->TexPixelsAlpha8,0,(long)(this->TexWidth * this->TexHeight));
      for (cfg_2._4_4_ = 0; cfg_2._4_4_ < (this->ConfigData).Size; cfg_2._4_4_ = cfg_2._4_4_ + 1) {
        tmp_2 = (ImFontTempBuildData *)
                ImVector<ImFontConfig>::operator[](&this->ConfigData,cfg_2._4_4_);
        psStack_140 = (stbtt_fontinfo *)((long)ptr + (long)cfg_2._4_4_ * 0x50);
        stbtt_PackSetOversampling
                  ((stbtt_pack_context *)&extra_rects.Data,((value_type *)tmp_2)->OversampleH,
                   ((value_type *)tmp_2)->OversampleV);
        stbtt_PackFontRangesRenderIntoRects
                  ((stbtt_pack_context *)&extra_rects.Data,psStack_140,
                   (stbtt_pack_range *)psStack_140[1].data,psStack_140[1].fontstart,
                   (stbrp_rect *)psStack_140[1].userdata);
        psStack_140[1].userdata = (void *)0x0;
      }
      stbtt_PackEnd((stbtt_pack_context *)&extra_rects.Data);
      ImGui::MemFree(buf_ranges);
      buf_ranges = (stbtt_pack_range *)0x0;
      for (cfg_3._4_4_ = 0; cfg_3._4_4_ < (this->ConfigData).Size; cfg_3._4_4_ = cfg_3._4_4_ + 1) {
        tmp_3 = (ImFontTempBuildData *)
                ImVector<ImFontConfig>::operator[](&this->ConfigData,cfg_3._4_4_);
        dst_font = (ImFont *)((long)ptr + (long)cfg_3._4_4_ * 0x50);
        _unscaled_ascent = ((value_type *)tmp_3)->DstFont;
        unscaled_descent =
             (int)stbtt_ScaleForPixelHeight
                            ((stbtt_fontinfo *)dst_font,((value_type *)tmp_3)->SizePixels);
        stbtt_GetFontVMetrics
                  ((stbtt_fontinfo *)dst_font,&unscaled_line_gap,(int *)&ascent,(int *)&descent);
        fVar12 = (float)unscaled_line_gap * (float)unscaled_descent;
        if (((ulong)tmp_3->Rects & 1) == 0) {
          _unscaled_ascent->ContainerAtlas = this;
          _unscaled_ascent->ConfigData = (ImFontConfig *)tmp_3;
          _unscaled_ascent->ConfigDataCount = 0;
          _unscaled_ascent->FontSize = (float)(tmp_3->FontInfo).numGlyphs;
          _unscaled_ascent->Ascent = fVar12;
          _unscaled_ascent->Descent = (float)(int)ascent * (float)unscaled_descent;
          ImVector<ImFont::Glyph>::resize(&_unscaled_ascent->Glyphs,0);
        }
        _unscaled_ascent->ConfigDataCount = _unscaled_ascent->ConfigDataCount + 1;
        if ((((ulong)tmp_3->Rects & 1) == 0) || (((ulong)tmp_3->Rects & 0x100) == 0)) {
          local_280 = 0.0;
        }
        else {
          local_280 = (fVar12 - _unscaled_ascent->Ascent) * 0.5;
        }
        _unscaled_ascent->FallbackGlyph = (Glyph *)0x0;
        for (range_1._0_4_ = 0; (int)range_1 < (int)dst_font->FallbackXAdvance;
            range_1._0_4_ = (int)range_1 + 1) {
          pGVar2 = dst_font->FallbackGlyph;
          for (pc._4_4_ = 0; pc._4_4_ < (int)pGVar2[(int)range_1].X1; pc._4_4_ = pc._4_4_ + 1) {
            register0x00000000 =
                 (short *)(*(long *)&pGVar2[(int)range_1].U0 + (long)pc._4_4_ * 0x1c);
            if ((((*register0x00000000 != 0) || (register0x00000000[2] != 0)) ||
                (register0x00000000[1] != 0)) || (register0x00000000[3] != 0)) {
              q.s1 = (float)((int)pGVar2[(int)range_1].XAdvance + pc._4_4_);
              if (((ulong)tmp_3->Rects & 1) != 0) {
                pGVar9 = ImFont::FindGlyph(_unscaled_ascent,q.s1._0_2_);
                if (pGVar9 != (Glyph *)0x0) goto LAB_0015c61a;
              }
              local_1c0 = 0.0;
              glyph._4_4_ = 0;
              stbtt_GetPackedQuad(*(stbtt_packedchar **)&pGVar2[(int)range_1].U0,this->TexWidth,
                                  this->TexHeight,pc._4_4_,&local_1c0,(float *)((long)&glyph + 4),
                                  (stbtt_aligned_quad *)&dummy_y,0);
              ImVector<ImFont::Glyph>::resize
                        (&_unscaled_ascent->Glyphs,(_unscaled_ascent->Glyphs).Size + 1);
              pvVar10 = ImVector<ImFont::Glyph>::back(&_unscaled_ascent->Glyphs);
              pvVar10->Codepoint = SUB42(q.s1,0);
              pvVar10->X0 = dummy_y;
              pvVar10->Y0 = dummy_x;
              pvVar10->X1 = q.s0;
              pvVar10->Y1 = q.t0;
              pvVar10->U0 = q.x0;
              pvVar10->V0 = q.y0;
              pvVar10->U1 = q.x1;
              pvVar10->V1 = q.y1;
              pvVar10->Y0 = (float)(int)(_unscaled_ascent->Ascent + local_280 + 0.5) + pvVar10->Y0;
              pvVar10->Y1 = (float)(int)(_unscaled_ascent->Ascent + local_280 + 0.5) + pvVar10->Y1;
              pvVar10->XAdvance =
                   *(float *)(stack0xfffffffffffffe68 + 8) + (float)(tmp_3->FontInfo).hhea;
              if (((tmp_3->FontInfo).glyf & 1) != 0) {
                pvVar10->XAdvance = (float)(int)(pvVar10->XAdvance + 0.5);
              }
            }
LAB_0015c61a:
          }
        }
        ImFont::BuildLookupTable(*(ImFont **)&tmp_3[1].FontInfo.fontstart);
      }
      ImGui::MemFree(buf_rects);
      ImGui::MemFree(pvStack_e0);
      ImGui::MemFree(ptr);
      RenderCustomTexData(this,1,local_a8);
      this_local._7_1_ = 1;
      ImVector<stbrp_rect>::~ImVector((ImVector<stbrp_rect> *)local_a8);
LAB_0015c6bd:
      return (bool)(this_local._7_1_ & 1);
    }
    pvVar5 = ImVector<ImFontConfig>::operator[](&this->ConfigData,cfg._4_4_);
    bVar11 = false;
    if (pvVar5->DstFont != (ImFont *)0x0) {
      bVar3 = ImFont::IsLoaded(pvVar5->DstFont);
      bVar11 = true;
      if (bVar3) {
        bVar11 = pvVar5->DstFont->ContainerAtlas == this;
      }
    }
    if (!bVar11) {
      __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == this)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                    ,0x4f9,"bool ImFontAtlas::Build()");
    }
    iVar4 = stbtt_GetFontOffsetForIndex((uchar *)pvVar5->FontData,pvVar5->FontNo);
    if (iVar4 < 0) {
      __assert_fail("font_offset >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                    ,0x4fb,"bool ImFontAtlas::Build()");
    }
    iVar4 = stbtt_InitFont((stbtt_fontinfo *)((long)ptr + (long)cfg._4_4_ * 0x50),
                           (uchar *)pvVar5->FontData,iVar4);
    if (iVar4 == 0) {
      this_local._7_1_ = 0;
      goto LAB_0015c6bd;
    }
    if (pvVar5->GlyphRanges == (ImWchar *)0x0) {
      pIVar6 = GetGlyphRangesDefault(this);
      pvVar5->GlyphRanges = pIVar6;
    }
    puStack_58 = pvVar5->GlyphRanges;
    while( true ) {
      bVar11 = false;
      if (*puStack_58 != 0) {
        bVar11 = puStack_58[1] != 0;
      }
      if (!bVar11) break;
      input_i = ((uint)puStack_58[1] - (uint)*puStack_58) + 1 + input_i;
      local_30 = local_30 + 1;
      puStack_58 = puStack_58 + 2;
    }
    cfg._4_4_ = cfg._4_4_ + 1;
  } while( true );
}

Assistant:

bool    ImFontAtlas::Build()
{
    IM_ASSERT(ConfigData.Size > 0);

    TexID = NULL;
    TexWidth = TexHeight = 0;
    TexUvWhitePixel = ImVec2(0, 0);
    ClearTexData();

    struct ImFontTempBuildData
    {
        stbtt_fontinfo      FontInfo;
        stbrp_rect*         Rects;
        stbtt_pack_range*   Ranges;
        int                 RangesCount;
    };
    ImFontTempBuildData* tmp_array = (ImFontTempBuildData*)ImGui::MemAlloc((size_t)ConfigData.Size * sizeof(ImFontTempBuildData));

    // Initialize font information early (so we can error without any cleanup) + count glyphs
    int total_glyph_count = 0;
    int total_glyph_range_count = 0;
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];

        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == this));
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0);
        if (!stbtt_InitFont(&tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Count glyphs
        if (!cfg.GlyphRanges)
            cfg.GlyphRanges = GetGlyphRangesDefault();
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2)
        {
            total_glyph_count += (in_range[1] - in_range[0]) + 1;
            total_glyph_range_count++;
        }
    }

    // Start packing. We need a known width for the skyline algorithm. Using a cheap heuristic here to decide of width. User can override TexDesiredWidth if they wish.
    // After packing is done, width shouldn't matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    TexWidth = (TexDesiredWidth > 0) ? TexDesiredWidth : (total_glyph_count > 4000) ? 4096 : (total_glyph_count > 2000) ? 2048 : (total_glyph_count > 1000) ? 1024 : 512;
    TexHeight = 0;
    const int max_tex_height = 1024*32;
    stbtt_pack_context spc;
    stbtt_PackBegin(&spc, NULL, TexWidth, max_tex_height, 0, 1, NULL);

    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    ImVector<stbrp_rect> extra_rects;
    RenderCustomTexData(0, &extra_rects);
    stbtt_PackSetOversampling(&spc, 1, 1);
    stbrp_pack_rects((stbrp_context*)spc.pack_info, &extra_rects[0], extra_rects.Size);
    for (int i = 0; i < extra_rects.Size; i++)
        if (extra_rects[i].was_packed)
            TexHeight = ImMax(TexHeight, extra_rects[i].y + extra_rects[i].h);

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    int buf_packedchars_n = 0, buf_rects_n = 0, buf_ranges_n = 0;
    stbtt_packedchar* buf_packedchars = (stbtt_packedchar*)ImGui::MemAlloc(total_glyph_count * sizeof(stbtt_packedchar));
    stbrp_rect* buf_rects = (stbrp_rect*)ImGui::MemAlloc(total_glyph_count * sizeof(stbrp_rect));
    stbtt_pack_range* buf_ranges = (stbtt_pack_range*)ImGui::MemAlloc(total_glyph_range_count * sizeof(stbtt_pack_range));
    memset(buf_packedchars, 0, total_glyph_count * sizeof(stbtt_packedchar));
    memset(buf_rects, 0, total_glyph_count * sizeof(stbrp_rect));              // Unnecessary but let's clear this for the sake of sanity.
    memset(buf_ranges, 0, total_glyph_range_count * sizeof(stbtt_pack_range));

    // First font pass: pack all glyphs (no rendering at this point, we are working with rectangles in an infinitely tall texture at this point)
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];

        // Setup ranges
        int glyph_count = 0;
        int glyph_ranges_count = 0;
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2)
        {
            glyph_count += (in_range[1] - in_range[0]) + 1;
            glyph_ranges_count++;
        }
        tmp.Ranges = buf_ranges + buf_ranges_n;
        tmp.RangesCount = glyph_ranges_count;
        buf_ranges_n += glyph_ranges_count;
        for (int i = 0; i < glyph_ranges_count; i++)
        {
            const ImWchar* in_range = &cfg.GlyphRanges[i * 2];
            stbtt_pack_range& range = tmp.Ranges[i];
            range.font_size = cfg.SizePixels;
            range.first_unicode_codepoint_in_range = in_range[0];
            range.num_chars = (in_range[1] - in_range[0]) + 1;
            range.chardata_for_range = buf_packedchars + buf_packedchars_n;
            buf_packedchars_n += range.num_chars;
        }

        // Pack
        tmp.Rects = buf_rects + buf_rects_n;
        buf_rects_n += glyph_count;
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        int n = stbtt_PackFontRangesGatherRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        stbrp_pack_rects((stbrp_context*)spc.pack_info, tmp.Rects, n);

        // Extend texture height
        for (int i = 0; i < n; i++)
            if (tmp.Rects[i].was_packed)
                TexHeight = ImMax(TexHeight, tmp.Rects[i].y + tmp.Rects[i].h);
    }
    IM_ASSERT(buf_rects_n == total_glyph_count);
    IM_ASSERT(buf_packedchars_n == total_glyph_count);
    IM_ASSERT(buf_ranges_n == total_glyph_range_count);

    // Create texture
    TexHeight = ImUpperPowerOfTwo(TexHeight);
    TexPixelsAlpha8 = (unsigned char*)ImGui::MemAlloc(TexWidth * TexHeight);
    memset(TexPixelsAlpha8, 0, TexWidth * TexHeight);
    spc.pixels = TexPixelsAlpha8;
    spc.height = TexHeight;

    // Second pass: render characters
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        stbtt_PackFontRangesRenderIntoRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    ImGui::MemFree(buf_rects);
    buf_rects = NULL;

    // Third pass: setup ImFont and glyphs for runtime
    for (int input_i = 0; input_i < ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        ImFont* dst_font = cfg.DstFont;

        float font_scale = stbtt_ScaleForPixelHeight(&tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        float ascent = unscaled_ascent * font_scale;
        float descent = unscaled_descent * font_scale;
        if (!cfg.MergeMode)
        {
            dst_font->ContainerAtlas = this;
            dst_font->ConfigData = &cfg;
            dst_font->ConfigDataCount = 0;
            dst_font->FontSize = cfg.SizePixels;
            dst_font->Ascent = ascent;
            dst_font->Descent = descent;
            dst_font->Glyphs.resize(0);
        }
        dst_font->ConfigDataCount++;
        float off_y = (cfg.MergeMode && cfg.MergeGlyphCenterV) ? (ascent - dst_font->Ascent) * 0.5f : 0.0f;

        dst_font->FallbackGlyph = NULL; // Always clear fallback so FindGlyph can return NULL. It will be set again in BuildLookupTable()
        for (int i = 0; i < tmp.RangesCount; i++)
        {
            stbtt_pack_range& range = tmp.Ranges[i];
            for (int char_idx = 0; char_idx < range.num_chars; char_idx += 1)
            {
                const stbtt_packedchar& pc = range.chardata_for_range[char_idx];
                if (!pc.x0 && !pc.x1 && !pc.y0 && !pc.y1)
                    continue;

                const int codepoint = range.first_unicode_codepoint_in_range + char_idx;
                if (cfg.MergeMode && dst_font->FindGlyph((unsigned short)codepoint))
                    continue;

                stbtt_aligned_quad q;
                float dummy_x = 0.0f, dummy_y = 0.0f;
                stbtt_GetPackedQuad(range.chardata_for_range, TexWidth, TexHeight, char_idx, &dummy_x, &dummy_y, &q, 0);

                dst_font->Glyphs.resize(dst_font->Glyphs.Size + 1);
                ImFont::Glyph& glyph = dst_font->Glyphs.back();
                glyph.Codepoint = (ImWchar)codepoint;
                glyph.X0 = q.x0; glyph.Y0 = q.y0; glyph.X1 = q.x1; glyph.Y1 = q.y1;
                glyph.U0 = q.s0; glyph.V0 = q.t0; glyph.U1 = q.s1; glyph.V1 = q.t1;
                glyph.Y0 += (float)(int)(dst_font->Ascent + off_y + 0.5f);
                glyph.Y1 += (float)(int)(dst_font->Ascent + off_y + 0.5f);
                glyph.XAdvance = (pc.xadvance + cfg.GlyphExtraSpacing.x);  // Bake spacing into XAdvance
                if (cfg.PixelSnapH)
                    glyph.XAdvance = (float)(int)(glyph.XAdvance + 0.5f);
            }
        }
        cfg.DstFont->BuildLookupTable();
    }

    // Cleanup temporaries
    ImGui::MemFree(buf_packedchars);
    ImGui::MemFree(buf_ranges);
    ImGui::MemFree(tmp_array);

    // Render into our custom data block
    RenderCustomTexData(1, &extra_rects);

    return true;
}